

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParsingTests.cpp
# Opt level: O1

void testScopedName(string_view text)

{
  SourceLineInfo *pSVar1;
  int iVar2;
  SyntaxNode *this;
  SourceManager *sourceManager;
  void *in_RSI;
  size_t in_RDI;
  bool bVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  AssertionHandler catchAssertionHandler;
  string local_e0;
  AssertionHandler local_c0;
  ReusableStringStream local_78;
  size_t local_68;
  void *local_60;
  undefined1 local_58 [8];
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  string *local_30;
  
  pSVar1 = &local_c0.m_assertionInfo.lineInfo;
  local_c0.m_assertionInfo.macroName.m_start = (char *)pSVar1;
  local_68 = in_RDI;
  local_60 = in_RSI;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,in_RSI,in_RDI + (long)in_RSI);
  this = &parseExpression((string *)&local_c0)->super_SyntaxNode;
  if ((SourceLineInfo *)local_c0.m_assertionInfo.macroName.m_start != pSVar1) {
    operator_delete(local_c0.m_assertionInfo.macroName.m_start,
                    (size_t)(local_c0.m_assertionInfo.lineInfo.file + 1));
  }
  local_58 = (undefined1  [8])0x9fed50;
  local_50 = 0xdb;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x23;
  capturedExpression.m_start = "expr.kind == SyntaxKind::ScopedName";
  Catch::AssertionHandler::AssertionHandler
            (&local_c0,macroName,(SourceLineInfo *)local_58,capturedExpression,Normal);
  local_30 = &local_e0;
  local_e0._M_dataplus._M_p._0_4_ = 0x1a1;
  local_50._0_2_ = CONCAT11(this->kind == ScopedName,true);
  local_58 = (undefined1  [8])&PTR_streamReconstructedExpression_00cb5430;
  local_48._8_8_ = (long)"!==" + 1;
  local_38 = 2;
  local_48._M_allocated_capacity = (size_type)this;
  Catch::AssertionHandler::handleExpr(&local_c0,(ITransientExpression *)local_58);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_58 = (undefined1  [8])0x9fed50;
  local_50 = 0xdc;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x17;
  capturedExpression_00.m_start = "expr.toString() == text";
  Catch::AssertionHandler::AssertionHandler
            (&local_c0,macroName_00,(SourceLineInfo *)local_58,capturedExpression_00,
             ContinueOnFailure);
  slang::syntax::SyntaxNode::toString_abi_cxx11_(&local_e0,this);
  if (local_68 == local_e0._M_string_length) {
    if (local_68 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_60,(void *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                             local_e0._M_dataplus._M_p._0_4_),local_68);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  local_50._0_2_ = CONCAT11(bVar3,true);
  local_58 = (undefined1  [8])&PTR_streamReconstructedExpression_00cb54f0;
  local_48._8_8_ = (long)"!==" + 1;
  local_38 = 2;
  local_30 = (string *)&local_68;
  local_48._M_allocated_capacity = (size_type)&local_e0;
  Catch::AssertionHandler::handleExpr(&local_c0,(ITransientExpression *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_) !=
      &local_e0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_),
                    local_e0.field_2._M_allocated_capacity + 1);
  }
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  sourceManager = getSourceManager();
  slang::Diagnostics::sort((Diagnostics *)&slang::diagnostics,sourceManager);
  if (DAT_00cdc828 != 0) {
    local_58 = (undefined1  [8])0x9fed50;
    local_50 = 0xdd;
    macroName_01.m_size = 10;
    macroName_01.m_start = "FAIL_CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&local_c0,macroName_01,(SourceLineInfo *)local_58,(StringRef)ZEXT816(0xa04334),
               ContinueOnFailure);
    local_78.m_index = 0;
    local_78.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_78);
    reportGlobalDiags_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              (local_78.m_oss,
               (char *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_),
               local_e0._M_string_length);
    Catch::ReusableStringStream::str_abi_cxx11_((string *)local_58,&local_78);
    Catch::AssertionHandler::handleMessage(&local_c0,ExplicitFailure,(string *)local_58);
    if (local_58 != (undefined1  [8])&local_48) {
      operator_delete((void *)local_58,(size_t)(local_48._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_) !=
        &local_e0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_),
                      local_e0.field_2._M_allocated_capacity + 1);
    }
    Catch::ReusableStringStream::~ReusableStringStream(&local_78);
    Catch::AssertionHandler::complete(&local_c0);
    if (local_c0.m_completed == false) {
      (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x14])();
    }
  }
  return;
}

Assistant:

void testScopedName(std::string_view text) {
    auto& expr = parseExpression(std::string(text));

    REQUIRE(expr.kind == SyntaxKind::ScopedName);
    CHECK(expr.toString() == text);
    CHECK_DIAGNOSTICS_EMPTY;
}